

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

size_t __thiscall
frozen::unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_>::count<int>
          (unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = bits::pmh_tables<128ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
                    ((pmh_tables<128ul,frozen::elsa<int>> *)&this->tables_,key,
                     (elsa<int> *)&this->tables_);
  if ((sVar1 == 0x80) || ((this->items_).data_[sVar1].first != *key)) {
    lVar2 = 0x400;
  }
  else {
    lVar2 = sVar1 << 3;
  }
  return (ulong)(lVar2 != 0x400);
}

Assistant:

constexpr std::size_t count(KeyType const &key) const {
    return find(key) != end();
  }